

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZWavyLine.h
# Opt level: O3

void __thiscall pzgeom::TPZWavyLine::SetData(TPZWavyLine *this,TPZVec<double> *wavedir,int numwaves)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  TPZManVector<double,_3> local_58;
  
  local_58.super_TPZVec<double>.fStore = (double *)0x0;
  local_58.super_TPZVec<double>.fNElements = 0;
  local_58.super_TPZVec<double>.fNAlloc = 0;
  local_58.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar1 = wavedir->fNElements;
  if ((long)uVar1 < 4) {
    local_58.super_TPZVec<double>.fStore = local_58.fExtAlloc;
    if ((long)uVar1 < 1) goto LAB_00e639fd;
  }
  else {
    local_58.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_58.super_TPZVec<double>.fNAlloc = uVar1;
  }
  pdVar2 = wavedir->fStore;
  uVar3 = 0;
  do {
    local_58.super_TPZVec<double>.fStore[uVar3] = pdVar2[uVar3];
    uVar3 = uVar3 + 1;
  } while (uVar1 != uVar3);
LAB_00e639fd:
  local_58.super_TPZVec<double>.fNElements = uVar1;
  TPZManVector<double,_3>::operator=(&this->fWaveDir,&local_58);
  TPZManVector<double,_3>::~TPZManVector(&local_58);
  this->fNumWaves = numwaves;
  return;
}

Assistant:

void SetData(TPZVec<REAL> &wavedir, int numwaves)
        {
#ifdef PZDEBUG
            if (wavedir.size() != 3) {
                DebugStop();
            }
#endif
            fWaveDir = wavedir;
            fNumWaves = numwaves;
        }